

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchFileObject
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmSourceFile *source;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  pointer ppVar5;
  string *str;
  cmGlobalGenerator *pcVar6;
  undefined4 extraout_var;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var7;
  allocator<char> local_1a1;
  string local_1a0;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  cmSourceFile *local_100;
  cmSourceFile *pchSf;
  string *filename;
  undefined1 local_e8 [8];
  string pchSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  bVar1 = std::operator!=(language,"C");
  if ((((bVar1) && (bVar1 = std::operator!=(language,"CXX"), bVar1)) &&
      (bVar1 = std::operator!=(language,"OBJC"), bVar1)) &&
     (bVar1 = std::operator!=(language,"OBJCXX"), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_a8,language,config);
    std::operator+(&local_88,&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   inserted._8_8_);
    std::make_pair<std::__cxx11::string,char_const(&)[1]>
              (&local_68,&local_88,(char (*) [1])0xd97e77);
    _Var7 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,char_const*>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->PchObjectFiles,&local_68);
    pchSource.field_2._8_8_ = _Var7.first._M_node;
    inserted.first._M_node._0_1_ = _Var7.second;
    local_40._M_node = (_Base_ptr)pchSource.field_2._8_8_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~pair(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    if (((byte)inserted.first._M_node & 1) != 0) {
      GetPchSource((string *)local_e8,this,config,language,(string *)inserted._8_8_);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_40);
        pchSf = (cmSourceFile *)&ppVar5->second;
        local_100 = cmMakefile::GetOrCreateSource(this->Makefile,(string *)local_e8,false,Known);
        cmAlphaNum::cmAlphaNum(&local_150,&this->ObjectDirectory);
        str = GetObjectName_abi_cxx11_(this,local_100);
        cmAlphaNum::cmAlphaNum(&local_180,str);
        cmStrCat<>(&local_120,&local_150,&local_180);
        std::__cxx11::string::operator=((string *)pchSf,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        pcVar6 = GetGlobalGenerator(this);
        uVar2 = (*pcVar6->_vptr_cmGlobalGenerator[0x26])();
        source = pchSf;
        if ((uVar2 & 1) != 0) {
          pcVar6 = GetGlobalGenerator(this);
          iVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x15])();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,(char *)CONCAT44(extraout_var,iVar3),&local_1a1);
          cmsys::SystemTools::ReplaceString((string *)source,&local_1a0,config);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
        }
        filename._4_4_ = 0;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        filename._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_e8);
      if (filename._4_4_ != 0) {
        return __return_storage_ptr__;
      }
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar5->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFileObject(const std::string& config,
                                                const std::string& language,
                                                const std::string& arch)
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchObjectFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchSource = this->GetPchSource(config, language, arch);
    if (pchSource.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    auto* pchSf = this->Makefile->GetOrCreateSource(
      pchSource, false, cmSourceFileLocationKind::Known);

    filename = cmStrCat(this->ObjectDirectory, this->GetObjectName(pchSf));
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      cmSystemTools::ReplaceString(
        filename, this->GetGlobalGenerator()->GetCMakeCFGIntDir(), config);
    }
  }
  return inserted.first->second;
}